

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

PropertySym * __thiscall
GlobOpt::CopyPropPropertySymObj(GlobOpt *this,SymOpnd *symOpnd,Instr *instr)

{
  SymID stackSymID;
  int32 propertyId;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32 propertyIdIndex;
  undefined4 *puVar5;
  PropertySym *this_00;
  Value *pVVar6;
  StackSym *copySym_00;
  PropertySymOpnd *this_01;
  StackSym *pSVar7;
  ValueInfo *this_02;
  Opnd *pOVar8;
  JsTypeValueInfo *local_a0;
  bool shouldOptimize;
  JsTypeValueInfo *newValueInfo;
  Value *newValue;
  StackSym *newTypeSym;
  PropertySymOpnd *propertySymOpnd;
  PropertySym *newProp;
  StackSym *copySym;
  Value *val;
  StackSym *objSym;
  PropertySym *propertySym;
  Instr *instr_local;
  SymOpnd *symOpnd_local;
  GlobOpt *this_local;
  
  bVar2 = Sym::IsPropertySym(symOpnd->m_sym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x7a9,"(symOpnd->m_sym->IsPropertySym())","symOpnd->m_sym->IsPropertySym()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Sym::AsPropertySym(symOpnd->m_sym);
  pSVar7 = this_00->m_stackSym;
  pVVar6 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar7->super_Sym);
  objSym = (StackSym *)this_00;
  if (pVVar6 != (Value *)0x0) {
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ObjPtrCopyPropPhase,uVar3,uVar4);
    if ((!bVar2) &&
       (copySym_00 = GlobOptBlockData::GetCopyPropSym
                               (&this->currentBlock->globOptData,&pSVar7->super_Sym,pVVar6),
       copySym_00 != (StackSym *)0x0)) {
      stackSymID = (copySym_00->super_Sym).m_id;
      propertyId = this_00->m_propertyId;
      propertyIdIndex = PropertySym::GetPropertyIdIndex(this_00);
      uVar3 = PropertySym::GetInlineCacheIndex(this_00);
      objSym = (StackSym *)
               PropertySym::FindOrCreate
                         (stackSymID,propertyId,propertyIdIndex,uVar3,
                          (this_00->super_Sym).field_0x15,this->func);
      bVar2 = IsLoopPrePass(this);
      if ((!bVar2) || (bVar2 = SafeToCopyPropInPrepass(this,pSVar7,copySym_00,pVVar6), bVar2)) {
        uVar3 = Func::GetSourceContextId(this->func);
        uVar4 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar3,uVar4);
        if (bVar2) {
          Output::Print(L"TRACE: ");
          IR::Opnd::Dump(&symOpnd->super_Opnd);
          Output::Print(L" : ");
          Output::Print(L"Copy prop obj ptr s%d, new property: ",(ulong)(copySym_00->super_Sym).m_id
                       );
          Sym::Dump((Sym *)objSym,ValueType::Uninitialized);
          Output::Print(L"\n");
        }
        CaptureByteCodeSymUses(this,instr);
        bVar2 = IsPropertySymPreparedForTypeCheckSeq(this,this_00);
        if (bVar2) {
          PreparePropertySymForTypeCheckSeq(this,(PropertySym *)objSym);
        }
        symOpnd->m_sym = (Sym *)objSym;
        IR::Opnd::SetIsJITOptimizedReg(&symOpnd->super_Opnd,true);
        bVar2 = IR::SymOpnd::IsPropertySymOpnd(symOpnd);
        if (bVar2) {
          this_01 = IR::Opnd::AsPropertySymOpnd(&symOpnd->super_Opnd);
          bVar2 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
          if (bVar2) {
            pSVar7 = StackSym::GetObjectTypeSym(copySym_00);
            pVVar6 = GlobOptBlockData::FindObjectTypeValueNoLivenessCheck
                               (&this->currentBlock->globOptData,pSVar7);
            if (pVVar6 == (Value *)0x0) {
              local_a0 = (JsTypeValueInfo *)0x0;
            }
            else {
              this_02 = ::Value::GetValueInfo(pVVar6);
              local_a0 = ValueInfo::AsJsType(this_02);
            }
            bVar2 = CompareCurrentTypesWithExpectedTypes(local_a0,this_01);
            if (!bVar2) {
              IR::PropertySymOpnd::SetTypeCheckSeqCandidate(this_01,false);
            }
          }
          IR::PropertySymOpnd::SetTypeDeadIfTypeCheckSeqCandidate(this_01,false);
        }
        bVar2 = IsLoopPrePass(this);
        if (bVar2) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->prePassCopyPropSym,(copySym_00->super_Sym).m_id);
        }
      }
      pOVar8 = IR::Instr::GetDst(instr);
      if (pOVar8 != (Opnd *)0x0) {
        pOVar8 = IR::Instr::GetDst(instr);
        bVar2 = IR::Opnd::IsEqual(&symOpnd->super_Opnd,pOVar8);
        if (bVar2) {
          ToVarUses(this,instr,&symOpnd->super_Opnd,true,(Value *)0x0);
        }
      }
    }
  }
  return (PropertySym *)objSym;
}

Assistant:

PropertySym *
GlobOpt::CopyPropPropertySymObj(IR::SymOpnd *symOpnd, IR::Instr *instr)
{
    Assert(symOpnd->m_sym->IsPropertySym());

    PropertySym *propertySym = symOpnd->m_sym->AsPropertySym();

    StackSym *objSym = propertySym->m_stackSym;

    Value * val = this->currentBlock->globOptData.FindValue(objSym);

    if (val && !PHASE_OFF(Js::ObjPtrCopyPropPhase, this->func))
    {
        StackSym *copySym = this->currentBlock->globOptData.GetCopyPropSym(objSym, val);
        if (copySym != nullptr)
        {
            PropertySym *newProp = PropertySym::FindOrCreate(
                copySym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->func);

            if (!this->IsLoopPrePass() || SafeToCopyPropInPrepass(objSym, copySym, val))
            {
#if DBG_DUMP
                if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
                {
                    Output::Print(_u("TRACE: "));
                    symOpnd->Dump();
                    Output::Print(_u(" : "));
                    Output::Print(_u("Copy prop obj ptr s%d, new property: "), copySym->m_id);
                    newProp->Dump();
                    Output::Print(_u("\n"));
                }
#endif

                // Copy prop
                this->CaptureByteCodeSymUses(instr);

                // If the old sym was part of an object type spec type check sequence,
                // let's make sure the new one is prepped for it as well.
                if (IsPropertySymPreparedForTypeCheckSeq(propertySym))
                {
                    PreparePropertySymForTypeCheckSeq(newProp);
                }
                symOpnd->m_sym = newProp;
                symOpnd->SetIsJITOptimizedReg(true);

                if (symOpnd->IsPropertySymOpnd())
                {
                    IR::PropertySymOpnd *propertySymOpnd = symOpnd->AsPropertySymOpnd();

                    if (propertySymOpnd->IsTypeCheckSeqCandidate())
                    {
                        // If the new pointer sym's expected type(s) don't match those in the inline-cache-based data for this access,
                        // we probably have a mismatch and can't safely objtypespec. If the saved objtypespecfldinfo isn't right for
                        // the new type, then we'll do an incorrect property access.
                        StackSym * newTypeSym = copySym->GetObjectTypeSym();
                        Value * newValue = currentBlock->globOptData.FindObjectTypeValueNoLivenessCheck(newTypeSym);
                        JsTypeValueInfo * newValueInfo = newValue ? newValue->GetValueInfo()->AsJsType() : nullptr;
                        bool shouldOptimize = CompareCurrentTypesWithExpectedTypes(newValueInfo, propertySymOpnd);
                        if (!shouldOptimize)
                        {
                            // We would like just to force a new type check here and keep optimizing, but downstream
                            // objtypespecfldinfo may have slot indices based on the old type.
                            propertySymOpnd->SetTypeCheckSeqCandidate(false);
                        }
                    }

                    // This is no longer strictly necessary, since we don't set the type dead bits in the initial
                    // backward pass, but let's keep it around for now in case we choose to revert to the old model.
                    propertySymOpnd->SetTypeDeadIfTypeCheckSeqCandidate(false);
                }

                if (this->IsLoopPrePass())
                {
                    this->prePassCopyPropSym->Set(copySym->m_id);
                }
            }
            propertySym = newProp;

            if(instr->GetDst() && symOpnd->IsEqual(instr->GetDst()))
            {
                // Make sure any stack sym uses in the new destination property sym are unspecialized
                instr = ToVarUses(instr, symOpnd, true, nullptr);
            }
        }
    }

    return propertySym;
}